

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  SectionInfo *__p;
  ScopedElement e;
  string local_58;
  XmlWriter *local_38;
  
  __p = (this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack.
        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
        super__Vector_impl_data._M_finish + -1;
  (this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<Catch::SectionInfo>::destroy<Catch::SectionInfo>
            ((new_allocator<Catch::SectionInfo> *)
             &(this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack,__p);
  iVar2 = this->m_sectionDepth;
  this->m_sectionDepth = iVar2 + -1;
  if (1 < iVar2) {
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"OverallResults","");
    XmlWriter::scopedElement
              ((XmlWriter *)&stack0xffffffffffffffc8,(string *)&this->m_xml,(XmlFormatting)&local_58
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"successes","");
    XmlWriter::writeAttribute<unsigned_long>(local_38,&local_58,&(sectionStats->assertions).passed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failures","");
    XmlWriter::writeAttribute<unsigned_long>(local_38,&local_58,&(sectionStats->assertions).failed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"expectedFailures","");
    XmlWriter::writeAttribute<unsigned_long>
              (local_38,&local_58,&(sectionStats->assertions).failedButOk);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    iVar2 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar2 == 1) {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"durationInSeconds","");
      XmlWriter::writeAttribute<double>(local_38,&local_58,&sectionStats->durationInSeconds);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }